

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O1

void __thiscall UtilizationWidget::drawGrid(UtilizationWidget *this)

{
  long lVar1;
  QPainter *pQVar2;
  int iVar3;
  int i;
  int iVar4;
  int iVar5;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  lVar1 = *(long *)&this->field_0x20;
  iVar3 = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  iVar5 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  pQVar2 = &this->painter;
  local_4c = 1;
  local_48 = 0x646464646464ffff;
  local_40 = local_40 & 0xffff0000;
  QPainter::setPen((QColor *)pQVar2);
  local_38 = (float)iVar3;
  local_3c = (float)iVar5;
  iVar4 = 0;
  do {
    local_34 = (float)iVar4 * 0.25;
    local_4c = (uint)(local_34 * local_38);
    local_48 = (ulong)local_4c << 0x20;
    local_40 = iVar5;
    QPainter::drawLines((QLine *)pQVar2,(int)&local_4c);
    local_40 = (uint)(local_34 * local_3c);
    local_4c = 0;
    local_48 = CONCAT44(iVar3,local_40);
    QPainter::drawLines((QLine *)pQVar2,(int)&local_4c);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 5);
  return;
}

Assistant:

void UtilizationWidget::drawGrid() {
    const int graphHeight = size().height();
    const int graphWidth = size().width();

    painter.setPen(QColor(100, 100, 100));

    for (int i = 0; i <= 4; ++i) {
        float k = (float) i / 4.0f;
        painter.drawLine(graphWidth * k, 0, graphWidth * k, graphHeight); // vertical
        painter.drawLine(0, graphHeight * k, graphWidth, graphHeight * k); // horizontal
    }
}